

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O2

REF_STATUS ref_adapt_parameter(REF_GRID ref_grid,REF_BOOL *all_done)

{
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_ADAPT pRVar1;
  REF_CELL pRVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  REF_INT RVar6;
  uint uVar7;
  REF_STATUS RVar8;
  REF_INT RVar9;
  undefined8 uVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  long lVar14;
  double dVar15;
  REF_DBL RVar16;
  double dVar17;
  REF_DBL RVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 uVar21;
  undefined4 uVar22;
  REF_INT max_age;
  REF_INT max_degree;
  REF_ADAPT local_1b0;
  REF_DBL min_normdev;
  REF_INT nnode;
  REF_DBL complexity;
  REF_DBL max_det;
  REF_INT int_mixed;
  REF_INT part;
  REF_DBL local_180;
  REF_DBL max_volume;
  REF_DBL min_volume;
  REF_DBL volume;
  REF_INT degree;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL min_quality;
  REF_DBL quality;
  double local_138;
  REF_BOOL *local_130;
  REF_DBL ratio;
  REF_DBL det;
  REF_LONG ncell;
  REF_INT local_10c;
  double local_108;
  REF_EDGE ref_edge;
  REF_DBL normdev;
  double local_f0;
  double local_e8;
  REF_INT local_mixed;
  REF_INT age;
  REF_DBL m [6];
  REF_INT nodes [27];
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  pRVar1 = ref_grid->adapt;
  int_mixed = 0;
  if ((((ref_grid->cell[6]->n < 1) && (ref_grid->cell[9]->n < 1)) && (ref_grid->cell[10]->n < 1)) &&
     (ref_grid->cell[0xb]->n < 1)) {
    local_mixed = 0;
  }
  else {
    local_mixed = 1;
    int_mixed = 1;
  }
  uVar7 = ref_mpi_max(ref_mpi,&local_mixed,&int_mixed,1);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "mpi max";
    uVar10 = 0x9d;
    goto LAB_0018d32c;
  }
  if (ref_grid->twod == 0) {
    lVar14 = 0x28;
    if (ref_grid->surf == 0) {
      lVar14 = 0x50;
    }
  }
  else {
    lVar14 = 0x28;
  }
  local_10c = int_mixed;
  pRVar2 = *(REF_CELL *)((long)ref_grid->cell + lVar14 + -0x10);
  min_quality = 1.0;
  min_volume = 1e+200;
  max_volume = -1e+200;
  complexity = 0.0;
  max_det = -1.0;
  ncell = 0;
  iVar13 = 0;
  local_1b0 = pRVar1;
  local_130 = all_done;
  while( true ) {
    if (pRVar2->max <= iVar13) break;
    RVar8 = ref_cell_nodes(pRVar2,iVar13,nodes);
    if (RVar8 == 0) {
      if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
        uVar7 = ref_node_tet_quality(ref_grid->node,nodes,&quality);
        if (uVar7 != 0) {
          uVar11 = (ulong)uVar7;
          pcVar12 = "qual";
          uVar10 = 0xb3;
          goto LAB_0018d32c;
        }
        uVar7 = ref_node_tet_vol(ref_grid->node,nodes,&volume);
        if (uVar7 != 0) {
          uVar11 = (ulong)uVar7;
          pcVar12 = "vol";
          uVar10 = 0xb4;
          goto LAB_0018d32c;
        }
      }
      else {
        uVar7 = ref_node_tri_quality(ref_grid->node,nodes,&quality);
        if (uVar7 != 0) {
          uVar11 = (ulong)uVar7;
          pcVar12 = "qual";
          uVar10 = 0xaf;
          goto LAB_0018d32c;
        }
        uVar7 = ref_node_tri_area(ref_grid->node,nodes,&volume);
        if (uVar7 != 0) {
          uVar11 = (ulong)uVar7;
          pcVar12 = "vol";
          uVar10 = 0xb0;
          goto LAB_0018d32c;
        }
      }
      if (quality <= min_quality) {
        min_quality = quality;
      }
      if (volume <= min_volume) {
        min_volume = volume;
      }
      if (max_volume <= volume) {
        max_volume = volume;
      }
      for (lVar14 = 0; lVar14 < pRVar2->node_per; lVar14 = lVar14 + 1) {
        if (ref_node->ref_mpi->id == ref_node->part[nodes[lVar14]]) {
          uVar7 = ref_node_metric_get(ref_node,nodes[lVar14],m);
          if (uVar7 != 0) {
            uVar11 = (ulong)uVar7;
            pcVar12 = "get";
            uVar10 = 0xbc;
            goto LAB_0018d32c;
          }
          uVar7 = ref_matrix_det_m(m,&det);
          if (uVar7 != 0) {
            uVar11 = (ulong)uVar7;
            pcVar12 = "det";
            uVar10 = 0xbd;
            goto LAB_0018d32c;
          }
          if (max_det <= det) {
            max_det = det;
          }
          if (ref_grid->surf == 0) {
            if (0.0 < det) {
              if (det < 0.0) {
                dVar17 = sqrt(det);
              }
              else {
                dVar17 = SQRT(det);
              }
              dVar17 = dVar17 * volume;
LAB_0018d6b8:
              complexity = dVar17 / (double)pRVar2->node_per + complexity;
            }
          }
          else {
            uVar7 = ref_node_tri_area(ref_grid->node,nodes,&min_normdev);
            if (uVar7 != 0) {
              uVar11 = (ulong)uVar7;
              pcVar12 = "vol";
              uVar10 = 0xc1;
              goto LAB_0018d32c;
            }
            uVar7 = ref_node_tri_normal(ref_grid->node,nodes,&normdev);
            if (uVar7 != 0) {
              uVar11 = (ulong)uVar7;
              pcVar12 = "norm";
              uVar10 = 0xc3;
              goto LAB_0018d32c;
            }
            RVar8 = ref_math_normalize(&normdev);
            if (RVar8 == 0) {
              dVar17 = (m[5] * local_e8 + m[2] * normdev + local_f0 * m[4]) * local_e8 +
                       (m[2] * local_e8 + m[0] * normdev + m[1] * local_f0) * normdev +
                       (m[4] * local_e8 + m[1] * normdev + m[3] * local_f0) * local_f0;
              auVar19._0_8_ = dVar17 * 1e+20;
              auVar19._8_8_ = det;
              auVar20._8_4_ = SUB84(det,0);
              auVar20._0_8_ = -auVar19._0_8_;
              auVar20._12_4_ = (uint)((ulong)det >> 0x20) ^ 0x80000000;
              auVar20 = maxpd(auVar19,auVar20);
              if (auVar20._8_8_ < auVar20._0_8_) {
                dVar17 = det / dVar17;
                if (0.0 < dVar17) {
                  if (dVar17 < 0.0) {
                    dVar17 = sqrt(dVar17);
                  }
                  else {
                    dVar17 = SQRT(dVar17);
                  }
                  dVar17 = dVar17 * min_normdev;
                  goto LAB_0018d6b8;
                }
              }
            }
          }
        }
      }
      uVar7 = ref_cell_part(pRVar2,ref_node,iVar13,&part);
      if (uVar7 != 0) {
        uVar11 = (ulong)uVar7;
        pcVar12 = "owner";
        uVar10 = 0xd6;
        goto LAB_0018d32c;
      }
      if (part == ref_mpi->id) {
        ncell = ncell + 1;
      }
    }
    iVar13 = iVar13 + 1;
  }
  quality = min_quality;
  uVar7 = ref_mpi_min(ref_mpi,&quality,&min_quality,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "mpi min";
    uVar10 = 0xda;
    goto LAB_0018d32c;
  }
  uVar7 = ref_mpi_bcast(ref_mpi,&quality,1,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "mbast";
    uVar10 = 0xdb;
    goto LAB_0018d32c;
  }
  volume = min_volume;
  uVar7 = ref_mpi_min(ref_mpi,&volume,&min_volume,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "mpi min";
    uVar10 = 0xdd;
    goto LAB_0018d32c;
  }
  uVar7 = ref_mpi_bcast(ref_mpi,&min_volume,1,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "bcast";
    uVar10 = 0xde;
    goto LAB_0018d32c;
  }
  volume = max_volume;
  uVar7 = ref_mpi_max(ref_mpi,&volume,&max_volume,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "mpi max";
    uVar10 = 0xe0;
    goto LAB_0018d32c;
  }
  uVar7 = ref_mpi_bcast(ref_mpi,&max_volume,1,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "bcast";
    uVar10 = 0xe1;
    goto LAB_0018d32c;
  }
  det = max_det;
  uVar7 = ref_mpi_max(ref_mpi,&det,&max_det,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "mpi max";
    uVar10 = 0xe3;
    goto LAB_0018d32c;
  }
  uVar7 = ref_mpi_bcast(ref_mpi,&max_det,1,3);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe4,
           "ref_adapt_parameter",(ulong)uVar7,"bcast");
    return uVar7;
  }
  if (max_det < 0.0) {
    dVar17 = sqrt(max_det);
  }
  else {
    dVar17 = SQRT(max_det);
  }
  if (max_det < 0.0) {
    dVar15 = sqrt(max_det);
  }
  else {
    dVar15 = SQRT(max_det);
  }
  if (dVar15 * *(double *)(&DAT_001ff570 + (ulong)(0.0 < dVar17 * 1e+20) * 8) <= 1.0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe5,
           "ref_adapt_parameter","can not invert sqrt(max_det)");
    return 1;
  }
  if (max_det < 0.0) {
    dVar17 = sqrt(max_det);
  }
  else {
    dVar17 = SQRT(max_det);
  }
  uVar7 = ref_mpi_allsum(ref_mpi,&complexity,1,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "dbl sum";
    uVar10 = 0xe8;
    goto LAB_0018d32c;
  }
  uVar7 = ref_mpi_allsum(ref_mpi,&ncell,1,2);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "cell int sum";
    uVar10 = 0xe9;
    goto LAB_0018d32c;
  }
  nnode = 0;
  iVar13 = 0;
  for (lVar14 = 0; lVar14 < ref_node->max; lVar14 = lVar14 + 1) {
    if ((-1 < ref_node->global[lVar14]) && (ref_node->ref_mpi->id == ref_node->part[lVar14])) {
      iVar13 = iVar13 + 1;
      nnode = iVar13;
    }
  }
  uVar7 = ref_mpi_allsum(ref_mpi,&nnode,1,1);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "int sum";
    uVar10 = 0xf1;
    goto LAB_0018d32c;
  }
  local_108 = (double)nnode / complexity;
  max_degree = 0;
  RVar9 = 0;
  for (lVar14 = 0; lVar14 < ref_node->max; lVar14 = lVar14 + 1) {
    RVar6 = max_degree;
    if (-1 < ref_node->global[lVar14]) {
      uVar7 = ref_adj_degree(pRVar2->ref_adj,(REF_INT)lVar14,&degree);
      if (uVar7 != 0) {
        uVar11 = (ulong)uVar7;
        pcVar12 = "cell degree";
        uVar10 = 0xf7;
        goto LAB_0018d32c;
      }
      RVar9 = degree;
      RVar6 = degree;
      if (degree < max_degree) {
        RVar9 = max_degree;
        RVar6 = max_degree;
      }
    }
    max_degree = RVar6;
  }
  degree = RVar9;
  uVar7 = ref_mpi_max(ref_mpi,&degree,&max_degree,1);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "mpi max";
    uVar10 = 0xfb;
    goto LAB_0018d32c;
  }
  uVar7 = ref_mpi_bcast(ref_mpi,&max_degree,1,1);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "min";
    uVar10 = 0xfc;
    goto LAB_0018d32c;
  }
  max_age = 0;
  age = 0;
  for (lVar14 = 0; lVar14 < ref_node->max; lVar14 = lVar14 + 1) {
    if ((-1 < ref_node->global[lVar14]) &&
       (iVar13 = ref_node->age[lVar14], max_age = age, age <= iVar13)) {
      age = iVar13;
      max_age = iVar13;
    }
  }
  uVar7 = ref_mpi_max(ref_mpi,&age,&max_age,1);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "mpi max";
    uVar10 = 0x103;
    goto LAB_0018d32c;
  }
  uVar7 = ref_mpi_bcast(ref_mpi,&max_age,1,1);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "min";
    uVar10 = 0x104;
    goto LAB_0018d32c;
  }
  min_normdev = 2.0;
  if ((ref_grid->geom->model != (void *)0x0) || (ref_grid->geom->meshlink != (void *)0x0)) {
    pRVar2 = ref_grid->cell[3];
    for (iVar13 = 0; iVar13 < pRVar2->max; iVar13 = iVar13 + 1) {
      RVar8 = ref_cell_nodes(pRVar2,iVar13,nodes);
      if (RVar8 == 0) {
        uVar7 = ref_geom_tri_norm_deviation(ref_grid,nodes,&normdev);
        if (uVar7 != 0) {
          uVar11 = (ulong)uVar7;
          pcVar12 = "norm dev";
          uVar10 = 0x10b;
          goto LAB_0018d32c;
        }
        if (normdev <= min_normdev) {
          min_normdev = normdev;
        }
      }
    }
  }
  normdev = min_normdev;
  uVar7 = ref_mpi_min(ref_mpi,&normdev,&min_normdev,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "mpi max";
    uVar10 = 0x110;
    goto LAB_0018d32c;
  }
  uVar7 = ref_mpi_bcast(ref_mpi,&min_normdev,1,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "min";
    uVar10 = 0x111;
    goto LAB_0018d32c;
  }
  min_ratio = 1e+200;
  max_ratio = -1e+200;
  uVar7 = ref_edge_create(&ref_edge,ref_grid);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "make edges";
    uVar10 = 0x115;
    goto LAB_0018d32c;
  }
  local_180 = 1e+200;
  local_138 = -1e+200;
  for (lVar14 = 0; lVar14 < ref_edge->n; lVar14 = lVar14 + 1) {
    uVar7 = ref_edge_part(ref_edge,(REF_INT)lVar14,&part);
    if (uVar7 != 0) {
      uVar11 = (ulong)uVar7;
      pcVar12 = "edge part";
      uVar10 = 0x117;
      goto LAB_0018d32c;
    }
    if (part == ref_grid->mpi->id) {
      uVar7 = ref_node_ratio(ref_grid->node,ref_edge->e2n[lVar14 * 2],ref_edge->e2n[lVar14 * 2 + 1],
                             &ratio);
      if (uVar7 != 0) {
        uVar11 = (ulong)uVar7;
        pcVar12 = "rat";
        uVar10 = 0x11c;
        goto LAB_0018d32c;
      }
      if (ratio <= local_180) {
        local_180 = ratio;
      }
      max_ratio = local_138;
      min_ratio = local_180;
      if (local_138 <= ratio) {
        max_ratio = ratio;
        local_138 = ratio;
      }
    }
  }
  uVar7 = ref_edge_free(ref_edge);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "free edge";
    uVar10 = 0x121;
    goto LAB_0018d32c;
  }
  ratio = local_180;
  uVar7 = ref_mpi_min(ref_mpi,&ratio,&min_ratio,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "mpi min";
    uVar10 = 0x123;
    goto LAB_0018d32c;
  }
  uVar7 = ref_mpi_bcast(ref_mpi,&min_ratio,1,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "min";
    uVar10 = 0x124;
    goto LAB_0018d32c;
  }
  ratio = local_138;
  uVar7 = ref_mpi_max(ref_mpi,&ratio,&max_ratio,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "mpi max";
    uVar10 = 0x126;
    goto LAB_0018d32c;
  }
  uVar7 = ref_mpi_bcast(ref_mpi,&max_ratio,1,3);
  if (uVar7 != 0) {
    uVar11 = (ulong)uVar7;
    pcVar12 = "max";
    uVar10 = 0x127;
    goto LAB_0018d32c;
  }
  dVar15 = 0.1;
  if (min_normdev <= 0.1) {
    dVar15 = min_normdev;
  }
  if (dVar15 <= 0.001) {
    dVar15 = 0.001;
  }
  local_1b0->post_min_normdev = dVar15;
  local_180 = 0.1;
  if (min_quality <= 0.1) {
    local_180 = min_quality;
  }
  if (local_180 <= 0.001) {
    local_180 = 0.001;
  }
  local_1b0->collapse_quality_absolute = local_180;
  local_1b0->smooth_min_quality = local_180;
  dVar15 = (1.0 / dVar17) * 0.01;
  RVar16 = 1e-15;
  if (dVar15 <= 1e-15) {
    RVar16 = dVar15;
  }
  ref_node->min_volume = RVar16;
  local_1b0->split_ratio_growth = 0;
  if (ref_grid->interp != (REF_INTERP)0x0) {
    local_1b0->split_ratio_growth = ref_grid->interp->continuously;
  }
  RVar16 = min_ratio;
  if (local_1b0->collapse_ratio <= min_ratio) {
    RVar16 = local_1b0->collapse_ratio;
  }
  local_1b0->post_min_ratio = RVar16;
  RVar18 = max_ratio;
  if (max_ratio <= local_1b0->split_ratio) {
    RVar18 = local_1b0->split_ratio;
  }
  bVar3 = 0.4 < RVar16;
  if (4.0 < RVar18 && bVar3) {
    RVar16 = RVar16 * (4.0 / RVar18);
  }
  bVar4 = 0.4 < RVar16;
  if ((1.6 < RVar18 && bVar4) && RVar18 < 3.5) {
    RVar16 = RVar16 * (1.4 / RVar18);
  }
  local_1b0->post_max_ratio = RVar18;
  if ((4.0 < RVar18 && bVar3) || ((1.6 < RVar18 && bVar4) && RVar18 < 3.5)) {
    local_1b0->post_min_ratio = RVar16;
  }
  uVar21 = 0x667f3bcd;
  uVar22 = 0x3ff6a09e;
  if (local_10c < 1) {
    uVar11 = ~-(ulong)(3.0 < local_108) & 0x3ff6a09e667f3bcd |
             (ulong)((max_ratio + 1.4142135623730951) * 0.5) & -(ulong)(3.0 < local_108);
    uVar21 = (undefined4)uVar11;
    uVar22 = (undefined4)(uVar11 >> 0x20);
  }
  local_1b0->split_ratio = (REF_DBL)CONCAT44(uVar22,uVar21);
  dVar15 = local_1b0->last_min_ratio - RVar16;
  if (dVar15 <= -dVar15) {
    dVar15 = -dVar15;
  }
  if (RVar16 * 0.01 <= dVar15) {
LAB_0018e547:
    *local_130 = 0;
  }
  else {
    dVar15 = local_1b0->last_max_ratio - RVar18;
    if (dVar15 <= -dVar15) {
      dVar15 = -dVar15;
    }
    if ((RVar18 * 0.01 <= dVar15) ||
       (((0x31 < max_age && ((3.0 <= RVar18 || (RVar16 <= 0.1)))) ||
        (1.5 < (double)CONCAT44(uVar22,uVar21) || (double)CONCAT44(uVar22,uVar21) == 1.5))))
    goto LAB_0018e547;
    *local_130 = 1;
    if (ref_grid->mpi->id == 0) {
      puts("termination recommended");
    }
  }
  uVar7 = ref_mpi_bcast(ref_mpi,local_130,1,1);
  if (uVar7 == 0) {
    uVar21 = *(undefined4 *)((long)&local_1b0->post_min_ratio + 4);
    uVar22 = *(undefined4 *)&local_1b0->post_max_ratio;
    uVar5 = *(undefined4 *)((long)&local_1b0->post_max_ratio + 4);
    *(undefined4 *)&local_1b0->last_min_ratio = *(undefined4 *)&local_1b0->post_min_ratio;
    *(undefined4 *)((long)&local_1b0->last_min_ratio + 4) = uVar21;
    *(undefined4 *)&local_1b0->last_max_ratio = uVar22;
    *(undefined4 *)((long)&local_1b0->last_max_ratio + 4) = uVar5;
    if (ref_grid->mpi->id != 0) {
      return 0;
    }
    printf("limit quality %6.4f normdev %6.4f ratio %6.4f %6.2f split %6.2f\n",local_180,
           local_1b0->post_min_normdev);
    printf("max degree %d max age %d normdev %7.4f\n",min_normdev,(ulong)(uint)max_degree,
           (ulong)(uint)max_age);
    printf("nnode %10d ncell %12ld complexity %12.1f ratio %5.2f\n",complexity,local_108,
           (ulong)(uint)nnode,ncell);
    printf("volume range %e %e metric %e floor %e\n",max_volume,min_volume,1.0 / dVar17,
           SUB84(ref_node->min_volume,0));
    return 0;
  }
  uVar11 = (ulong)uVar7;
  pcVar12 = "done";
  uVar10 = 0x15c;
LAB_0018d32c:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",uVar10,
         "ref_adapt_parameter",uVar11,pcVar12);
  return (REF_STATUS)uVar11;
}

Assistant:

REF_FCN static REF_STATUS ref_adapt_parameter(REF_GRID ref_grid,
                                              REF_BOOL *all_done) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_ADAPT ref_adapt = ref_grid->adapt;
  REF_CELL ref_cell;
  REF_INT cell;
  REF_LONG ncell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL det, max_det, complexity, min_metric_vol;
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_DBL volume, min_volume, max_volume;
  REF_DBL target_quality, target_normdev;
  REF_INT cell_node;
  REF_INT node, nnode;
  REF_DBL nodes_per_complexity;
  REF_INT degree, max_degree;
  REF_DBL ratio, min_ratio, max_ratio;
  REF_INT edge, part;
  REF_INT age, max_age;
  REF_EDGE ref_edge;
  REF_DBL m[6];
  REF_INT int_mixed, local_mixed;
  REF_BOOL mixed;

  int_mixed = 0;
  if (ref_cell_n(ref_grid_qua(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_hex(ref_grid)) > 0)
    int_mixed = 1;
  local_mixed = int_mixed;
  RSS(ref_mpi_max(ref_mpi, &local_mixed, &int_mixed, REF_INT_TYPE), "mpi max");
  mixed = (int_mixed > 0);

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  min_quality = 1.0;
  min_volume = REF_DBL_MAX;
  max_volume = REF_DBL_MIN;
  max_det = -1.0;
  complexity = 0.0;
  ncell = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      RSS(ref_node_tri_area(ref_grid_node(ref_grid), nodes, &volume), "vol");
    } else {
      RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      RSS(ref_node_tet_vol(ref_grid_node(ref_grid), nodes, &volume), "vol");
    }
    min_quality = MIN(min_quality, quality);
    min_volume = MIN(min_volume, volume);
    max_volume = MAX(max_volume, volume);

    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        RSS(ref_node_metric_get(ref_node, nodes[cell_node], m), "get");
        RSS(ref_matrix_det_m(m, &det), "det");
        max_det = MAX(max_det, det);
        if (ref_grid_surf(ref_grid)) {
          REF_DBL area, normal[3], normal_projection;
          RSS(ref_node_tri_area(ref_grid_node(ref_grid), nodes, &area), "vol");
          RSS(ref_node_tri_normal(ref_grid_node(ref_grid), nodes, normal),
              "norm");

          if (REF_SUCCESS == ref_math_normalize(normal)) {
            normal_projection = ref_matrix_vt_m_v(m, normal);
            if (ref_math_divisible(det, normal_projection)) {
              if (det / normal_projection > 0.0) {
                complexity += sqrt(det / normal_projection) * area /
                              ((REF_DBL)ref_cell_node_per(ref_cell));
              }
            }
          }
        } else {
          if (det > 0.0) {
            complexity +=
                sqrt(det) * volume / ((REF_DBL)ref_cell_node_per(ref_cell));
          }
        }
      }
    }
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "owner");
    if (part == ref_mpi_rank(ref_mpi)) ncell++;
  }
  quality = min_quality;
  RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "mbast");
  volume = min_volume;
  RSS(ref_mpi_min(ref_mpi, &volume, &min_volume, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_volume, 1, REF_DBL_TYPE), "bcast");
  volume = max_volume;
  RSS(ref_mpi_max(ref_mpi, &volume, &max_volume, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_volume, 1, REF_DBL_TYPE), "bcast");
  det = max_det;
  RSS(ref_mpi_max(ref_mpi, &det, &max_det, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_det, 1, REF_DBL_TYPE), "bcast");
  RAS(ref_math_divisible(1.0, sqrt(max_det)), "can not invert sqrt(max_det)");
  min_metric_vol = 1.0 / sqrt(max_det);

  RSS(ref_mpi_allsum(ref_mpi, &complexity, 1, REF_DBL_TYPE), "dbl sum");
  RSS(ref_mpi_allsum(ref_mpi, &ncell, 1, REF_LONG_TYPE), "cell int sum");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, &nnode, 1, REF_INT_TYPE), "int sum");

  nodes_per_complexity = (REF_DBL)nnode / complexity;

  max_degree = 0;
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_adj_degree(ref_cell_adj(ref_cell), node, &degree), "cell degree");
    max_degree = MAX(max_degree, degree);
  }
  degree = max_degree;
  RSS(ref_mpi_max(ref_mpi, &degree, &max_degree, REF_INT_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_degree, 1, REF_INT_TYPE), "min");

  max_age = 0;
  each_ref_node_valid_node(ref_node, node) {
    max_age = MAX(max_age, ref_node_age(ref_node, node));
  }
  age = max_age;
  RSS(ref_mpi_max(ref_mpi, &age, &max_age, REF_INT_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_age, 1, REF_INT_TYPE), "min");

  min_normdev = 2.0;
  if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
      ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
    }
  }
  normdev = min_normdev;
  RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");

  min_ratio = REF_DBL_MAX;
  max_ratio = REF_DBL_MIN;
  RSS(ref_edge_create(&ref_edge, ref_grid), "make edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      min_ratio = MIN(min_ratio, ratio);
      max_ratio = MAX(max_ratio, ratio);
    }
  }
  RSS(ref_edge_free(ref_edge), "free edge");
  ratio = min_ratio;
  RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
  ratio = max_ratio;
  RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

  target_normdev = MAX(MIN(0.1, min_normdev), 1.0e-3);
  ref_adapt->post_min_normdev = target_normdev;

  target_quality = MAX(MIN(0.1, min_quality), 1.0e-3);
  ref_adapt->collapse_quality_absolute = target_quality;
  ref_adapt->smooth_min_quality = target_quality;

  ref_node->min_volume = MIN(1.0e-15, 0.01 * min_metric_vol);

  /* allow edge growth when interpolating metric continuously */
  ref_adapt->split_ratio_growth = REF_FALSE;
  if (NULL != ref_grid_interp(ref_grid)) {
    ref_adapt->split_ratio_growth =
        ref_interp_continuously(ref_grid_interp(ref_grid));
  }

  /* bound ratio to current range */
  ref_adapt->post_min_ratio = MIN(min_ratio, ref_adapt->collapse_ratio);
  ref_adapt->post_max_ratio = MAX(max_ratio, ref_adapt->split_ratio);

  if (ref_adapt->post_max_ratio > 4.0 && ref_adapt->post_min_ratio > 0.4) {
    ref_adapt->post_min_ratio =
        (4.0 / ref_adapt->post_max_ratio) * ref_adapt->post_min_ratio;
  }

  /* when close to convergence, prevent high lower limit from stopping split */
  if (ref_adapt->post_max_ratio < 3.5 && ref_adapt->post_max_ratio > 1.6 &&
      ref_adapt->post_min_ratio > 0.4) {
    ref_adapt->post_min_ratio =
        (1.4 / ref_adapt->post_max_ratio) * ref_adapt->post_min_ratio;
  }

  ref_adapt->split_ratio = sqrt(2.0);
  /* prevent overshoot of number of nodes, unless unreliable due to mixed */
  if (!mixed && nodes_per_complexity > 3.0)
    ref_adapt->split_ratio = 0.5 * (sqrt(2.0) + max_ratio);

  if (ABS(ref_adapt->last_min_ratio - ref_adapt->post_min_ratio) <
          1e-2 * ref_adapt->post_min_ratio &&
      ABS(ref_adapt->last_max_ratio - ref_adapt->post_max_ratio) <
          1e-2 * ref_adapt->post_max_ratio &&
      (max_age < 50 ||
       (ref_adapt->post_min_ratio > 0.1 && ref_adapt->post_max_ratio < 3.0)) &&
      1.5 > ref_adapt->split_ratio) {
    *all_done = REF_TRUE;
    if (ref_grid_once(ref_grid)) {
      printf("termination recommended\n");
    }
  } else {
    *all_done = REF_FALSE;
  }
  RSS(ref_mpi_bcast(ref_mpi, all_done, 1, REF_INT_TYPE), "done");

  ref_adapt->last_min_ratio = ref_adapt->post_min_ratio;
  ref_adapt->last_max_ratio = ref_adapt->post_max_ratio;

  if (ref_grid_once(ref_grid)) {
    printf("limit quality %6.4f normdev %6.4f ratio %6.4f %6.2f split %6.2f\n",
           target_quality, ref_adapt->post_min_normdev,
           ref_adapt->post_min_ratio, ref_adapt->post_max_ratio,
           ref_adapt->split_ratio);
    printf("max degree %d max age %d normdev %7.4f\n", max_degree, max_age,
           min_normdev);
    printf("nnode %10d ncell %12ld complexity %12.1f ratio %5.2f\n", nnode,
           ncell, complexity, nodes_per_complexity);
    printf("volume range %e %e metric %e floor %e\n", max_volume, min_volume,
           min_metric_vol, ref_node->min_volume);
  }

  return REF_SUCCESS;
}